

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O1

void Abc_TgPurgeSymmetry(Abc_TgMan_t *pMan,int fHigh)

{
  ulong *puVar1;
  char *pcVar2;
  byte bVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  word *pwVar8;
  word wVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  byte bVar14;
  byte bVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  word *pwVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  word *pLimit;
  word *pwVar23;
  ulong uVar24;
  ulong uVar25;
  ulong *puVar26;
  ulong *puVar27;
  uint uVar28;
  int iVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  bool bVar33;
  int scnt [16];
  int fDone [16];
  uint local_1b4;
  ulong local_160;
  ulong local_148 [3];
  long local_130;
  ulong local_128;
  ulong local_120;
  word *local_118;
  ulong local_110;
  ulong local_108;
  long local_100;
  int aiStack_f8 [16];
  int local_b8 [16];
  uint auStack_78 [18];
  
  uVar17 = pMan->nVars;
  local_148[0] = 0;
  local_148[1] = 0;
  if (pMan->fPhased == 0) {
    local_148[0]._0_1_ = 0;
    if ('\0' < pMan->pGroup[0].nGVars) {
      uVar28 = 1 << ((byte)(uVar17 - 6) & 0x1f);
      if ((int)uVar28 < 2) {
        uVar28 = 1;
      }
      lVar32 = 0;
      do {
        bVar3 = pMan->pPerm[lVar32];
        uVar20 = (uint)(char)bVar3;
        if ((char)bVar3 < '\0') {
          local_148[0] = (ulong)(byte)local_148[0];
          __assert_fail("jVar >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                        ,0x792,"void Abc_TgPurgeSymmetry(Abc_TgMan_t *, int)");
        }
        if ((int)uVar17 <= (int)uVar20) {
          local_148[0] = (ulong)(byte)local_148[0];
          __assert_fail("iVar < nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                        ,0x582,"int Abc_TtHasVar(word *, int, int)");
        }
        puVar27 = pMan->pTruth;
        if ((int)uVar17 < 7) {
          if ((s_Truths6Neg[uVar20] & (*puVar27 >> ((byte)(1 << (bVar3 & 0x1f)) & 0x3f) ^ *puVar27))
              == 0) goto LAB_00500147;
        }
        else {
          if ((char)bVar3 < '\x06') {
            if (uVar17 - 6 != 0x1f) {
              uVar22 = 0;
              do {
                if (((puVar27[uVar22] >> ((byte)(1 << (bVar3 & 0x1f)) & 0x3f) ^ puVar27[uVar22]) &
                    s_Truths6Neg[uVar20]) != 0) goto LAB_00500169;
                uVar22 = uVar22 + 1;
              } while (uVar28 != uVar22);
            }
          }
          else if (uVar17 - 6 != 0x1f) {
            puVar1 = puVar27 + (1 << ((byte)(uVar17 - 6) & 0x1f));
            bVar14 = (byte)(uVar20 - 6);
            uVar18 = 1 << (bVar14 & 0x1f);
            iVar29 = 2 << (bVar14 & 0x1f);
            uVar22 = 1;
            if (1 < (int)uVar18) {
              uVar22 = (ulong)uVar18;
            }
            puVar26 = puVar27 + (int)uVar18;
            do {
              if (uVar20 - 6 != 0x1f) {
                uVar12 = 0;
                do {
                  if (puVar27[uVar12] != puVar26[uVar12]) goto LAB_00500169;
                  uVar12 = uVar12 + 1;
                } while (uVar22 != uVar12);
              }
              puVar27 = puVar27 + iVar29;
              puVar26 = puVar26 + iVar29;
            } while (puVar27 < puVar1);
          }
LAB_00500147:
          pMan->symLink[uVar20] = pMan->symLink[(int)uVar17];
          pMan->symLink[(int)uVar17] = bVar3;
          pMan->pPerm[lVar32] = -1;
          local_148[0]._0_1_ = (byte)local_148[0] + 1;
        }
LAB_00500169:
        lVar32 = lVar32 + 1;
      } while (lVar32 < pMan->pGroup[0].nGVars);
    }
    local_148[0] = (ulong)(byte)local_148[0];
  }
  uVar12 = (ulong)(uint)pMan->nGroups;
  uVar22 = (ulong)uVar17;
  if (0 < pMan->nGroups) {
    local_120 = (ulong)uVar17;
    lVar32 = 0;
LAB_00500200:
    bVar33 = true;
    if (lVar32 == 0) {
      bVar33 = pMan->fPhased != 0;
    }
    cVar4 = pMan->pGroup[lVar32].nGVars;
    uVar17 = (uint)cVar4;
    uVar22 = (ulong)uVar17;
    local_130 = lVar32;
    cVar5 = pMan->pGroup[lVar32].iStart;
    if ('\0' < cVar4) {
      memset(local_b8,0,(ulong)(uVar17 * 4));
      uVar12 = 0;
      do {
        aiStack_f8[uVar12] = 1;
        uVar12 = uVar12 + 1;
      } while (uVar22 != uVar12);
    }
    lVar10 = (long)cVar5 + 0x1c;
    local_108 = (ulong)(uVar17 - 1);
    cVar5 = '\0';
    lVar32 = local_130;
LAB_0050029a:
    uVar12 = 0;
    if ('\x01' < cVar4) {
      local_160 = 1;
      uVar21 = 0;
LAB_005002b3:
      bVar3 = pMan->pPerm[uVar21 + lVar10 + -0x1c];
      uVar17 = (uint)(char)bVar3;
      uVar13 = (ulong)uVar17;
      if ((-1 < (int)uVar17) && (local_b8[uVar21] == 0)) {
        local_110 = uVar12;
        bVar14 = (byte)(uVar17 - 6);
        uVar28 = 1 << (bVar14 & 0x1f);
        uVar12 = 1;
        if (1 < (int)uVar28) {
          uVar12 = (ulong)uVar28;
        }
        local_128 = (ulong)(uint)(1 << (bVar3 & 0x1f));
        local_148[2] = (long)(int)uVar17;
        local_118 = pSymCopy + (int)uVar28;
        local_100 = (long)(2 << (bVar14 & 0x1f)) << 3;
        uVar24 = local_160;
LAB_00500351:
        bVar14 = pMan->pPerm[uVar24 + lVar10 + -0x1c];
        uVar28 = (uint)(char)bVar14;
        local_1b4 = 0;
        if ((-1 < (char)bVar14) && (aiStack_f8[uVar24] == aiStack_f8[uVar21])) {
          if (aiStack_f8[uVar24] == 1) {
            pwVar8 = pMan->pTruth;
            iVar29 = pMan->nVars;
            uVar20 = 1 << ((char)iVar29 - 6U & 0x1f);
            if (iVar29 < 7) {
              uVar20 = 1;
            }
            if ((int)uVar20 < 1) {
              Abc_TtSwapVars(pSymCopy,iVar29,uVar17,uVar28);
              local_1b4 = 2;
            }
            else {
              lVar32 = 0;
              do {
                *(undefined8 *)((long)pSymCopy + lVar32) = *(undefined8 *)((long)pwVar8 + lVar32);
                lVar32 = lVar32 + 8;
              } while ((ulong)uVar20 << 3 != lVar32);
              Abc_TtSwapVars(pSymCopy,iVar29,uVar17,uVar28);
              lVar32 = 0;
              do {
                if (*(long *)((long)pwVar8 + lVar32) != *(long *)((long)pSymCopy + lVar32)) {
                  local_1b4 = 0;
                  goto LAB_00500512;
                }
                lVar32 = lVar32 + 8;
              } while ((ulong)uVar20 << 3 != lVar32);
              local_1b4 = 2;
            }
LAB_00500512:
            if (bVar33) goto LAB_00500a57;
            bVar15 = (byte)local_128;
            if (uVar20 == 1) {
              pSymCopy[0] = (s_Truths6[local_148[2]] & pSymCopy[0]) >> (bVar15 & 0x3f) |
                            pSymCopy[0] << (bVar15 & 0x3f) & s_Truths6[local_148[2]];
            }
            else if ((char)bVar3 < '\x06') {
              if (0 < (int)uVar20) {
                uVar30 = s_Truths6[local_148[2]];
                lVar32 = 0;
                do {
                  *(ulong *)((long)pSymCopy + lVar32) =
                       (*(ulong *)((long)pSymCopy + lVar32) & uVar30) >> (bVar15 & 0x3f) |
                       *(ulong *)((long)pSymCopy + lVar32) << (bVar15 & 0x3f) & uVar30;
                  lVar32 = lVar32 + 8;
                } while ((ulong)uVar20 << 3 != lVar32);
              }
            }
            else if (0 < (int)uVar20) {
              pwVar23 = pSymCopy;
              pwVar19 = local_118;
              do {
                if (uVar17 - 6 != 0x1f) {
                  uVar30 = 0;
                  do {
                    wVar9 = pwVar23[uVar30];
                    pwVar23[uVar30] = pwVar19[uVar30];
                    pwVar19[uVar30] = wVar9;
                    uVar30 = uVar30 + 1;
                  } while (uVar12 != uVar30);
                }
                pwVar23 = (word *)((long)pwVar23 + local_100);
                pwVar19 = (word *)((long)pwVar19 + local_100);
              } while (pwVar23 < pSymCopy + (int)uVar20);
            }
            if (uVar20 == 1) {
              bVar15 = (byte)(1 << (bVar14 & 0x1f));
              pSymCopy[0] = (s_Truths6[bVar14] & pSymCopy[0]) >> (bVar15 & 0x3f) |
                            pSymCopy[0] << (bVar15 & 0x3f) & s_Truths6[bVar14];
LAB_005009f5:
              uVar28 = 1;
              if ((int)uVar20 < 1) goto LAB_00500a2b;
              lVar32 = 0;
              do {
                if (*(long *)((long)pwVar8 + lVar32) != *(long *)((long)pSymCopy + lVar32))
                goto LAB_00500a3c;
                lVar32 = lVar32 + 8;
              } while ((ulong)uVar20 << 3 != lVar32);
            }
            else {
              if ('\x05' < (char)bVar14) {
                if ((int)uVar20 < 1) goto LAB_00500a40;
                bVar14 = (byte)(uVar28 - 6);
                uVar18 = 1 << (bVar14 & 0x1f);
                iVar29 = 2 << (bVar14 & 0x1f);
                uVar30 = 1;
                if (1 < (int)uVar18) {
                  uVar30 = (ulong)uVar18;
                }
                pwVar19 = pSymCopy + (int)uVar18;
                pwVar23 = pSymCopy;
                do {
                  if (uVar28 - 6 != 0x1f) {
                    uVar25 = 0;
                    do {
                      wVar9 = pwVar23[uVar25];
                      pwVar23[uVar25] = pwVar19[uVar25];
                      pwVar19[uVar25] = wVar9;
                      uVar25 = uVar25 + 1;
                    } while (uVar30 != uVar25);
                  }
                  pwVar23 = pwVar23 + iVar29;
                  pwVar19 = pwVar19 + iVar29;
                } while (pwVar23 < pSymCopy + (int)uVar20);
                goto LAB_005009f5;
              }
              if (0 < (int)uVar20) {
                uVar30 = s_Truths6[(int)uVar28];
                lVar32 = 0;
                do {
                  bVar15 = (byte)(1 << (bVar14 & 0x1f));
                  *(ulong *)((long)pSymCopy + lVar32) =
                       (*(ulong *)((long)pSymCopy + lVar32) & uVar30) >> (bVar15 & 0x3f) |
                       *(ulong *)((long)pSymCopy + lVar32) << (bVar15 & 0x3f) & uVar30;
                  lVar32 = lVar32 + 8;
                } while ((ulong)uVar20 << 3 != lVar32);
                goto LAB_005009f5;
              }
LAB_00500a40:
              uVar28 = 1;
            }
          }
          else {
            uVar20 = 1 << ((char)pMan->nVars - 6U & 0x1f);
            if (pMan->nVars < 7) {
              uVar20 = 1;
            }
            uVar30 = (ulong)uVar20;
            if (0 < (int)uVar20) {
              pwVar8 = pMan->pTruth;
              lVar32 = 0;
              do {
                *(undefined8 *)((long)pSymCopy + lVar32) = *(undefined8 *)((long)pwVar8 + lVar32);
                lVar32 = lVar32 + 8;
              } while (uVar30 * 8 - lVar32 != 0);
            }
            uVar25 = uVar13;
            uVar18 = uVar28;
            if ((char)(bVar14 | bVar3) < '\0') {
LAB_00500d9f:
              __assert_fail("iv < 0 && jv < 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                            ,0x6fb,"int Abc_TtIsSymmetricHigh(Abc_TgMan_t *, int, int, int)");
            }
            do {
              Abc_TtSwapVars(pSymCopy,pMan->nVars,(int)uVar25,uVar18);
              cVar7 = pMan->symLink[uVar25];
              cVar6 = pMan->symLink[uVar18];
              if (cVar7 < 0) break;
              uVar25 = (ulong)(uint)(int)cVar7;
              uVar18 = (int)cVar6;
            } while (-1 < cVar6);
            if ((-1 < cVar7) || (-1 < cVar6)) goto LAB_00500d9f;
            pwVar8 = pMan->pTruth;
            local_1b4 = 2;
            if (0 < (int)uVar20) {
              lVar32 = 0;
              do {
                if (*(long *)((long)pwVar8 + lVar32) != *(long *)((long)pSymCopy + lVar32)) {
                  local_1b4 = 0;
                  break;
                }
                lVar32 = lVar32 + 8;
              } while (uVar30 * 8 - lVar32 != 0);
            }
            if (bVar33) goto LAB_00500a57;
            if (-1 < (char)(bVar14 | bVar3)) {
              uVar25 = uVar13;
              do {
                if (pMan->symPhase[uVar25] != '\0') {
                  if (uVar20 == 1) {
                    bVar14 = (byte)(1 << ((byte)uVar25 & 0x1f));
                    pSymCopy[0] = (s_Truths6[uVar25] & pSymCopy[0]) >> (bVar14 & 0x3f) |
                                  pSymCopy[0] << (bVar14 & 0x3f) & s_Truths6[uVar25];
                  }
                  else if ((int)uVar25 < 6) {
                    if (0 < (int)uVar20) {
                      uVar16 = s_Truths6[uVar25];
                      lVar32 = 0;
                      do {
                        bVar14 = (byte)(1 << ((byte)uVar25 & 0x1f));
                        *(ulong *)((long)pSymCopy + lVar32) =
                             (*(ulong *)((long)pSymCopy + lVar32) & uVar16) >> (bVar14 & 0x3f) |
                             *(ulong *)((long)pSymCopy + lVar32) << (bVar14 & 0x3f) & uVar16;
                        lVar32 = lVar32 + 8;
                      } while (uVar30 * 8 - lVar32 != 0);
                    }
                  }
                  else if (0 < (int)uVar20) {
                    iVar29 = (int)uVar25 + -6;
                    bVar14 = (byte)iVar29;
                    uVar18 = 1 << (bVar14 & 0x1f);
                    iVar11 = 2 << (bVar14 & 0x1f);
                    uVar16 = 1;
                    if (1 < (int)uVar18) {
                      uVar16 = (ulong)uVar18;
                    }
                    pwVar19 = pSymCopy + (int)uVar18;
                    pwVar23 = pSymCopy;
                    do {
                      if (iVar29 != 0x1f) {
                        uVar31 = 0;
                        do {
                          wVar9 = pwVar23[uVar31];
                          pwVar23[uVar31] = pwVar19[uVar31];
                          pwVar19[uVar31] = wVar9;
                          uVar31 = uVar31 + 1;
                        } while (uVar16 != uVar31);
                      }
                      pwVar23 = pwVar23 + iVar11;
                      pwVar19 = pwVar19 + iVar11;
                    } while (pwVar23 < pSymCopy + (int)uVar20);
                  }
                }
                if (pMan->symPhase[uVar28] != '\0') {
                  if (uVar20 == 1) {
                    bVar14 = (byte)(1 << ((byte)uVar28 & 0x1f));
                    pSymCopy[0] = (s_Truths6[uVar28] & pSymCopy[0]) >> (bVar14 & 0x3f) |
                                  pSymCopy[0] << (bVar14 & 0x3f) & s_Truths6[uVar28];
                  }
                  else if ((int)uVar28 < 6) {
                    if (0 < (int)uVar20) {
                      uVar16 = s_Truths6[uVar28];
                      lVar32 = 0;
                      do {
                        bVar14 = (byte)(1 << ((byte)uVar28 & 0x1f));
                        *(ulong *)((long)pSymCopy + lVar32) =
                             (*(ulong *)((long)pSymCopy + lVar32) & uVar16) >> (bVar14 & 0x3f) |
                             *(ulong *)((long)pSymCopy + lVar32) << (bVar14 & 0x3f) & uVar16;
                        lVar32 = lVar32 + 8;
                      } while (uVar30 * 8 - lVar32 != 0);
                    }
                  }
                  else if (0 < (int)uVar20) {
                    bVar14 = (byte)(uVar28 - 6);
                    uVar18 = 1 << (bVar14 & 0x1f);
                    iVar29 = 2 << (bVar14 & 0x1f);
                    uVar16 = 1;
                    if (1 < (int)uVar18) {
                      uVar16 = (ulong)uVar18;
                    }
                    pwVar19 = pSymCopy + (int)uVar18;
                    pwVar23 = pSymCopy;
                    do {
                      if (uVar28 - 6 != 0x1f) {
                        uVar31 = 0;
                        do {
                          wVar9 = pwVar23[uVar31];
                          pwVar23[uVar31] = pwVar19[uVar31];
                          pwVar19[uVar31] = wVar9;
                          uVar31 = uVar31 + 1;
                        } while (uVar16 != uVar31);
                      }
                      pwVar23 = pwVar23 + iVar29;
                      pwVar19 = pwVar19 + iVar29;
                    } while (pwVar23 < pSymCopy + (int)uVar20);
                  }
                }
                pcVar2 = pMan->symLink + uVar25;
                uVar25 = (ulong)(uint)(int)*pcVar2;
              } while ((-1 < *pcVar2) &&
                      (uVar16 = (ulong)uVar28, uVar28 = (uint)pMan->symLink[uVar16],
                      -1 < pMan->symLink[uVar16]));
            }
            uVar28 = 1;
            if (0 < (int)uVar20) {
              lVar32 = 0;
              do {
                if (*(long *)((long)pwVar8 + lVar32) != *(long *)((long)pSymCopy + lVar32))
                goto LAB_00500a3c;
                lVar32 = lVar32 + 8;
              } while (uVar30 << 3 != lVar32);
              goto LAB_00500a4a;
            }
LAB_00500a2b:
            uVar28 = 1;
          }
          goto LAB_00500a4a;
        }
        goto LAB_00500a57;
      }
      goto LAB_00500c7a;
    }
    goto LAB_00500ca2;
  }
LAB_00500cd4:
  uVar21 = 0;
  iVar29 = (int)uVar22;
  if (0 < iVar29) {
    do {
      if (pMan->pPerm[uVar21] < '\0') goto LAB_00500cef;
      uVar21 = uVar21 + 1;
    } while (uVar22 != uVar21);
    uVar21 = uVar22 & 0xffffffff;
  }
LAB_00500cef:
  uVar22 = uVar21 & 0xffffffff;
  while( true ) {
    lVar32 = (long)(int)uVar21 << 0x20;
    uVar13 = (long)(int)uVar21;
    do {
      uVar21 = uVar13 + 1;
      if ((long)iVar29 <= (long)uVar21) goto LAB_00500d3a;
      lVar32 = lVar32 + 0x100000000;
      lVar10 = uVar13 + 1;
      uVar13 = uVar21;
    } while (pMan->pPerm[lVar10] < '\0');
    if ((long)iVar29 <= (long)uVar21) break;
    pMan->pPerm[uVar22] = pMan->pPerm[lVar32 >> 0x20];
    uVar22 = uVar22 + 1;
  }
LAB_00500d3a:
  iVar29 = (int)uVar12;
  if (iVar29 < 1) {
    iVar11 = 0;
  }
  else {
    uVar22 = 0;
    iVar11 = 0;
    do {
      cVar4 = *(char *)((long)local_148 + uVar22);
      pcVar2 = &pMan->pGroup[uVar22].nGVars;
      *pcVar2 = *pcVar2 - cVar4;
      pMan->pGroup[uVar22].iStart = pMan->pGroup[uVar22].iStart - (char)iVar11;
      iVar11 = iVar11 + cVar4;
      uVar22 = uVar22 + 1;
    } while ((uVar12 & 0xffffffff) != uVar22);
  }
  if (pMan->pGroup[0].nGVars == '\0') {
    pMan->nGroups = iVar29 + -1;
    memmove(pMan->pGroup,pMan->pGroup + 1,(long)iVar29 * 2 - 2);
    if (pMan->pGroup[0].iStart != '\0') {
      __assert_fail("pMan->pGroup[0].iStart == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                    ,0x7b2,"void Abc_TgPurgeSymmetry(Abc_TgMan_t *, int)");
    }
  }
  pMan->nGVars = pMan->nGVars - iVar11;
  return;
LAB_00500a3c:
  uVar28 = 0;
LAB_00500a4a:
  local_1b4 = local_1b4 | uVar28;
LAB_00500a57:
  auStack_78[uVar24] = local_1b4;
  uVar24 = uVar24 + 1;
  if (uVar24 == uVar22) goto code_r0x00500a6b;
  goto LAB_00500351;
code_r0x00500a6b:
  local_b8[uVar21] = 1;
  uVar12 = local_110;
  uVar24 = local_160;
  do {
    cVar7 = pMan->pPerm[uVar24 + lVar10 + -0x1c];
    uVar28 = (uint)cVar7;
    uVar17 = auStack_78[uVar24];
    cVar6 = cVar7;
    if (uVar17 == 3) {
      while (uVar12 = uVar13, -1 < cVar6) {
        pMan->symPhase[uVar28] = '\0';
        uVar12 = (ulong)uVar28;
        uVar28 = (uint)pMan->symLink[uVar12];
        cVar6 = pMan->symLink[uVar12];
      }
LAB_00500c23:
      do {
        uVar30 = uVar12;
        uVar12 = (ulong)(uint)(int)pMan->symLink[uVar30];
      } while (-1 < pMan->symLink[uVar30]);
      pMan->symLink[uVar30] = cVar7;
      pMan->pPerm[uVar24 + lVar10 + -0x1c] = -1;
      aiStack_f8[uVar21] = aiStack_f8[uVar21] + aiStack_f8[uVar24];
      local_b8[uVar21] = 0;
      cVar5 = cVar5 + '\x01';
      uVar12 = 1;
    }
    else {
      if (uVar17 == 2) {
LAB_00500bec:
        pMan->symPhase[uVar13] = pMan->symPhase[uVar13] + pMan->symPhase[cVar7];
        uVar12 = uVar13;
        goto LAB_00500c23;
      }
      if (uVar17 == 1) {
        while (-1 < cVar6) {
          if (pMan->symPhase[uVar28] != '\0') {
            iVar29 = pMan->nVars + -6;
            uVar17 = 1 << ((byte)iVar29 & 0x1f);
            bVar3 = pMan->pPermTRev[uVar28];
            iVar11 = (int)(char)bVar3;
            puVar27 = pMan->pTruth;
            if (pMan->nVars < 7) {
              bVar14 = (byte)(1 << (bVar3 & 0x1f));
              *puVar27 = (s_Truths6[iVar11] & *puVar27) >> (bVar14 & 0x3f) |
                         *puVar27 << (bVar14 & 0x3f) & s_Truths6[iVar11];
            }
            else if ((char)bVar3 < '\x06') {
              if (iVar29 != 0x1f) {
                uVar12 = s_Truths6[iVar11];
                uVar30 = 0;
                do {
                  bVar14 = (byte)(1 << (bVar3 & 0x1f));
                  puVar27[uVar30] =
                       (puVar27[uVar30] & uVar12) >> (bVar14 & 0x3f) |
                       puVar27[uVar30] << (bVar14 & 0x3f) & uVar12;
                  uVar30 = uVar30 + 1;
                } while (uVar17 != uVar30);
              }
            }
            else if (iVar29 != 0x1f) {
              puVar1 = puVar27 + (int)uVar17;
              bVar14 = (byte)(iVar11 + -6);
              uVar17 = 1 << (bVar14 & 0x1f);
              iVar29 = 2 << (bVar14 & 0x1f);
              uVar12 = 1;
              if (1 < (int)uVar17) {
                uVar12 = (ulong)uVar17;
              }
              puVar26 = puVar27 + (int)uVar17;
              do {
                if (iVar11 + -6 != 0x1f) {
                  uVar30 = 0;
                  do {
                    uVar25 = puVar27[uVar30];
                    puVar27[uVar30] = puVar26[uVar30];
                    puVar26[uVar30] = uVar25;
                    uVar30 = uVar30 + 1;
                  } while (uVar12 != uVar30);
                }
                puVar27 = puVar27 + iVar29;
                puVar26 = puVar26 + iVar29;
              } while (puVar27 < puVar1);
            }
            pMan->uPhase = pMan->uPhase ^ 1 << (bVar3 & 0x1f);
          }
          uVar12 = (ulong)uVar28;
          uVar28 = (uint)pMan->symLink[uVar12];
          cVar6 = pMan->symLink[uVar12];
        }
        goto LAB_00500bec;
      }
    }
    uVar24 = uVar24 + 1;
  } while (uVar24 != uVar22);
LAB_00500c7a:
  uVar21 = uVar21 + 1;
  local_160 = local_160 + 1;
  if (uVar21 == local_108) goto code_r0x00500c9d;
  goto LAB_005002b3;
code_r0x00500c9d:
  uVar12 = (ulong)((int)uVar12 != 0);
  lVar32 = local_130;
LAB_00500ca2:
  if ((fHigh == 0) || ((char)uVar12 == '\0')) goto LAB_00500cb1;
  goto LAB_0050029a;
LAB_00500cb1:
  *(char *)((long)local_148 + lVar32) = *(char *)((long)local_148 + lVar32) + cVar5;
  lVar32 = lVar32 + 1;
  uVar12 = (ulong)pMan->nGroups;
  uVar22 = local_120;
  if ((long)uVar12 <= lVar32) goto LAB_00500cd4;
  goto LAB_00500200;
}

Assistant:

static void Abc_TgPurgeSymmetry(Abc_TgMan_t * pMan, int fHigh)
{
    int i, j, k, sum = 0, nVars = pMan->nVars;
    signed char *symLink = pMan->symLink;
    char gcnt[16] = { 0 };
    char * pPerm = pMan->pPerm;

    // purge unsupported variables
    if (!pMan->fPhased)
    {
        int iVar = pMan->nVars;
        for (j = 0; j < pMan->pGroup[0].nGVars; j++)
        {
            int jVar = pPerm[j];
            assert(jVar >= 0);
            if (!Abc_TtHasVar(pMan->pTruth, nVars, jVar))
            {
                symLink[jVar] = symLink[iVar];
                symLink[iVar] = jVar;
                pPerm[j] = -1;
                gcnt[0]++;
            }
        }
    }

    for (k = 0; k < pMan->nGroups; k++)
        gcnt[k] += Abc_TgGroupSymmetry(pMan, pMan->pGroup + k, fHigh);

    for (i = 0; i < nVars && pPerm[i] >= 0; i++)
        ;
    for (j = i + 1; ; i++, j++)
    {
        while (j < nVars && pPerm[j] < 0) j++;
        if (j >= nVars) break;
        pPerm[i] = pPerm[j];
    }
    for (k = 0; k < pMan->nGroups; k++)
    {
        pMan->pGroup[k].nGVars -= gcnt[k];
        pMan->pGroup[k].iStart -= sum;
        sum += gcnt[k];
    }
    if (pMan->pGroup[0].nGVars == 0)
    {
        pMan->nGroups--;
        memmove(pMan->pGroup, pMan->pGroup + 1, sizeof(TiedGroup) * pMan->nGroups);
        assert(pMan->pGroup[0].iStart == 0);
    }
    pMan->nGVars -= sum;
}